

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

string * __thiscall
rcg::Device::getAccessStatus_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  mutex *__mutex;
  PIFGetDeviceInfo p_Var1;
  Interface *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar2;
  int iVar3;
  GC_ERROR GVar4;
  void *pvVar5;
  undefined8 uVar6;
  char *pcVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R12;
  pointer unaff_R13;
  int32_t status;
  INFO_DATATYPE type;
  size_t size;
  undefined4 local_40;
  INFO_DATATYPE local_3c;
  size_t local_38;
  
  __mutex = &this->mtx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar6 = std::__throw_system_error(iVar3);
    if (unaff_R12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R12);
    }
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (pcVar2 != unaff_R13) {
      operator_delete(pcVar2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_3c = 0;
  local_40 = 0xffffffff;
  local_38 = 4;
  if (this->dev == (DEV_HANDLE)0x0) {
    pvVar5 = Interface::getHandle
                       ((this->parent).
                        super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (pvVar5 == (void *)0x0) {
      GVar4 = -0x3e9;
    }
    else {
      p_Var1 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               IFGetDeviceInfo;
      this_00 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      this_01 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      pvVar5 = Interface::getHandle(this_00);
      GVar4 = (*p_Var1)(pvVar5,(this->id)._M_dataplus._M_p,5,&local_3c,&local_40,&local_38);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
  }
  else {
    GVar4 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DevGetInfo)(this->dev,5,&local_3c,&local_40,&local_38);
  }
  if ((GVar4 == 0) && (local_3c == 5)) {
    switch(local_40) {
    case 1:
      pcVar7 = "ReadWrite";
      break;
    case 2:
      pcVar7 = "ReadOnly";
      break;
    case 3:
      pcVar7 = "NoAccess";
      break;
    case 4:
      pcVar7 = "Busy";
      break;
    case 5:
    case 6:
      pcVar7 = "OpenReadWrite";
      break;
    default:
      pcVar7 = "Unknown";
    }
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)pcVar7);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

std::string Device::getAccessStatus()
{
  std::lock_guard<std::mutex> lock(mtx);
  std::string ret;

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  int32_t status=-1;
  size_t size=sizeof(status);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (dev != 0)
  {
    err=gentl->DevGetInfo(dev, GenTL::DEVICE_INFO_ACCESS_STATUS, &type, &status, &size);
  }
  else if (parent->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(getParent()->getHandle(), id.c_str(),
                               GenTL::DEVICE_INFO_ACCESS_STATUS, &type, &status, &size);
  }

  if (err == GenTL::GC_ERR_SUCCESS)
  {
    if (type == GenTL::INFO_DATATYPE_INT32)
    {
      switch (status)
      {
        case GenTL::DEVICE_ACCESS_STATUS_READWRITE:
          ret="ReadWrite";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_READONLY:
          ret="ReadOnly";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_NOACCESS:
          ret="NoAccess";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_BUSY:
          ret="Busy";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_OPEN_READWRITE:
          ret="OpenReadWrite";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_OPEN_READONLY:
          ret="OpenReadWrite";
          break;

        default:
          ret="Unknown";
          break;
      }
    }
  }

  return ret;
}